

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply-names.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_13::NameApplier::BeginTryTableExpr(NameApplier *this,TryTableExpr *expr)

{
  pointer pTVar1;
  pointer pTVar2;
  Result RVar3;
  Var *in_RCX;
  Var *var;
  bool bVar4;
  string_view sVar5;
  string_view name;
  
  pTVar1 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pTVar2 = (expr->catches).super__Vector_base<wabt::TableCatch,_std::allocator<wabt::TableCatch>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  bVar4 = pTVar1 == pTVar2;
  if (!bVar4) {
    var = &pTVar1->target;
    do {
      if (((var[1].loc.filename._M_len & 0xfffffffe) != 2) &&
         (RVar3 = UseNameForTagVar(this,var + -1), RVar3.enum_ == Error)) {
        if (!bVar4) {
          return (Result)Error;
        }
        break;
      }
      sVar5 = FindLabelByVar(this,var);
      name._M_str = (char *)var;
      name._M_len = (size_t)sVar5._M_str;
      UseNameForVar((NameApplier *)sVar5._M_len,name,in_RCX);
      bVar4 = (pointer)&var[1].loc.filename._M_str == pTVar2;
      var = (Var *)&var[2].field_2;
    } while (!bVar4);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->labels_,&(expr->block).label);
  return (Result)Ok;
}

Assistant:

Result NameApplier::BeginTryTableExpr(TryTableExpr* expr) {
  for (TableCatch& catch_ : expr->catches) {
    if (!catch_.IsCatchAll()) {
      CHECK_RESULT(UseNameForTagVar(&catch_.tag));
    }
    std::string_view label = FindLabelByVar(&catch_.target);
    UseNameForVar(label, &catch_.target);
  }
  PushLabel(expr->block.label);
  return Result::Ok;
}